

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIEnvironment::removeFont(CGUIEnvironment *this,IGUIFont *font)

{
  int *piVar1;
  pointer pSVar2;
  IGUIFont *pIVar3;
  _func_int *p_Var4;
  int iVar5;
  long lVar6;
  
  if (font != (IGUIFont *)0x0) {
    pSVar2 = (this->Fonts).m_data.
             super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)((long)(this->Fonts).m_data.
                                super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) >> 3) *
            0x38e38e39;
    if (iVar5 != 0) {
      lVar6 = 0;
      do {
        pIVar3 = *(IGUIFont **)((long)&pSVar2->Font + lVar6);
        if (pIVar3 == font) {
          p_Var4 = pIVar3->_vptr_IGUIFont[-3];
          piVar1 = (int *)(&pIVar3->field_0x10 + (long)p_Var4);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (**(code **)(*(long *)((long)&pIVar3->_vptr_IGUIFont + (long)p_Var4) + 8))();
          }
          std::
          vector<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
          ::_M_erase(&(this->Fonts).m_data,
                     (SFont *)((long)&(((this->Fonts).m_data.
                                        super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->NamedPath).Path
                              + lVar6));
          return;
        }
        lVar6 = lVar6 + 0x48;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  return;
}

Assistant:

void CGUIEnvironment::removeFont(IGUIFont *font)
{
	if (!font)
		return;
	for (u32 i = 0; i < Fonts.size(); ++i) {
		if (Fonts[i].Font == font) {
			Fonts[i].Font->drop();
			Fonts.erase(i);
			return;
		}
	}
}